

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O3

void __thiscall
SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
::Remove(SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
         *this,void *key,PinRecord *pOut)

{
  hash_t hVar1;
  SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> **ppSVar2;
  EntryType *pEVar3;
  EntryType *current;
  
  hVar1 = PrimePolicy::ModPrime((hash_t)((ulong)key >> 4),this->size,this->modFunctionIndex);
  current = this->table[hVar1];
  if (current != (EntryType *)0x0) {
    if (current->key == key) {
      ppSVar2 = this->table + hVar1;
    }
    else {
      do {
        pEVar3 = current;
        current = pEVar3->next;
        if (current == (EntryType *)0x0) {
          return;
        }
      } while (current->key != key);
      ppSVar2 = &pEVar3->next;
    }
    *ppSVar2 = current->next;
    if (pOut != (PinRecord *)0x0) {
      pOut->refCount = (current->value).refCount;
      pOut->stackBackTraces = (current->value).stackBackTraces;
    }
    FreeEntry(this,current);
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Remove(this->stats,this->table[hVar1] == (EntryType *)0x0);
      return;
    }
  }
  return;
}

Assistant:

void Remove(TKey key, TData* pOut)
    {
        uint val = HashKeyToBucket(key);
        EntryType **prev=&table[val];
        for (EntryType * current = *prev ; current != nullptr; current = current->next)
        {
            if (Comparer<TKey>::Equals(key, current->key))
            {
                *prev = current->next;
                if (pOut != nullptr)
                {
                    (*pOut) = current->value;
                }

                FreeEntry(current);
#if PROFILE_DICTIONARY
                if (stats)
                    stats->Remove(table[val] == nullptr);
#endif
                break;
            }
            prev = &current->next;
        }
    }